

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_follow(Curl_easy *data,char *newurl,followtype type)

{
  CURLUcode CVar1;
  uint uVar2;
  CURLcode CVar3;
  size_t sVar4;
  char *pcVar5;
  Curl_handler *pCVar6;
  char *pcVar7;
  uint local_84;
  Curl_handler *p;
  char *scheme;
  _Bool clear;
  char *pcStack_48;
  int port;
  char *portnum;
  char *referer;
  CURLU *u;
  byte local_26;
  byte local_25;
  CURLUcode uc;
  _Bool reachedmax;
  _Bool disallowport;
  char *pcStack_20;
  followtype type_local;
  char *newurl_local;
  Curl_easy *data_local;
  
  local_25 = 0;
  local_26 = 0;
  if (type != FOLLOW_FAKE) {
    (data->state).requests = (data->state).requests + 1;
  }
  uc = type;
  pcStack_20 = newurl;
  newurl_local = (char *)data;
  if (type == FOLLOW_REDIR) {
    if (((data->set).maxredirs == -1) || ((data->state).followlocation < (data->set).maxredirs)) {
      *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffffffd | 2;
      (data->state).followlocation = (data->state).followlocation + 1;
      if ((*(ulong *)&(data->set).field_0x8e2 >> 0x18 & 1) != 0) {
        portnum = (char *)0x0;
        if ((*(uint *)&(data->state).field_0x6d0 >> 0x12 & 1) != 0) {
          (*Curl_cfree)((data->state).referer);
          newurl_local[0x11f0] = '\0';
          newurl_local[0x11f1] = '\0';
          newurl_local[0x11f2] = '\0';
          newurl_local[0x11f3] = '\0';
          newurl_local[0x11f4] = '\0';
          newurl_local[0x11f5] = '\0';
          newurl_local[0x11f6] = '\0';
          newurl_local[0x11f7] = '\0';
          *(uint *)(newurl_local + 0x1300) = *(uint *)(newurl_local + 0x1300) & 0xfffbffff;
        }
        referer = (char *)curl_url();
        if ((CURLU *)referer == (CURLU *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        u._4_4_ = curl_url_set((CURLU *)referer,CURLUPART_URL,*(char **)(newurl_local + 0x11e8),0);
        if (u._4_4_ == CURLUE_OK) {
          u._4_4_ = curl_url_set((CURLU *)referer,CURLUPART_FRAGMENT,(char *)0x0,0);
        }
        if (u._4_4_ == CURLUE_OK) {
          u._4_4_ = curl_url_set((CURLU *)referer,CURLUPART_USER,(char *)0x0,0);
        }
        if (u._4_4_ == CURLUE_OK) {
          u._4_4_ = curl_url_set((CURLU *)referer,CURLUPART_PASSWORD,(char *)0x0,0);
        }
        if (u._4_4_ == CURLUE_OK) {
          u._4_4_ = curl_url_get((CURLU *)referer,CURLUPART_URL,&portnum,0);
        }
        curl_url_cleanup((CURLU *)referer);
        if ((u._4_4_ != CURLUE_OK) || (portnum == (char *)0x0)) {
          return CURLE_OUT_OF_MEMORY;
        }
        *(char **)(newurl_local + 0x11f0) = portnum;
        *(uint *)(newurl_local + 0x1300) = *(uint *)(newurl_local + 0x1300) & 0xfffbffff | 0x40000;
      }
    }
    else {
      local_26 = 1;
      uc = CURLUE_BAD_HANDLE;
    }
  }
  if ((((uc != CURLUE_BAD_PARTPOINTER) && (*(int *)(newurl_local + 0x140) != 0x191)) &&
      (*(int *)(newurl_local + 0x140) != 0x197)) &&
     (sVar4 = Curl_is_absolute_url(pcStack_20,(char *)0x0,0,false), sVar4 != 0)) {
    local_25 = 1;
  }
  if (uc == CURLUE_BAD_HANDLE) {
    local_84 = 8;
  }
  else {
    uVar2 = 0;
    if (uc == CURLUE_MALFORMED_INPUT) {
      uVar2 = 0x80;
    }
    local_84 = 0;
    if (((uint)((ulong)*(undefined8 *)(newurl_local + 0xa92) >> 0x29) & 1) != 0) {
      local_84 = 0x10;
    }
    local_84 = uVar2 | 0x800 | local_84;
  }
  u._4_4_ = curl_url_set(*(CURLU **)(newurl_local + 0x1198),CURLUPART_URL,pcStack_20,local_84);
  pcVar7 = newurl_local;
  if (u._4_4_ == CURLUE_OK) {
    u._4_4_ = curl_url_get(*(CURLU **)(newurl_local + 0x1198),CURLUPART_URL,&stack0xffffffffffffffe0
                           ,0);
    if (u._4_4_ != CURLUE_OK) {
      CVar3 = Curl_uc_to_curlcode(u._4_4_);
      return CVar3;
    }
    CVar1 = CURLUE_OK;
    if (((*(ulong *)(newurl_local + 0xa92) >> 0x15 & 1) == 0) && (uc != CURLUE_BAD_HANDLE)) {
      scheme._3_1_ = 0;
      if ((*(short *)(newurl_local + 0x1e8) == 0) ||
         ((*(uint *)(newurl_local + 0x1300) >> 4 & 1) == 0)) {
        u._4_4_ = curl_url_get(*(CURLU **)(newurl_local + 0x1198),CURLUPART_PORT,
                               &stack0xffffffffffffffb8,1);
        if (u._4_4_ != CURLUE_OK) {
          (*Curl_cfree)(pcStack_20);
          CVar3 = Curl_uc_to_curlcode(u._4_4_);
          return CVar3;
        }
        scheme._4_4_ = atoi(pcStack_48);
        (*Curl_cfree)(pcStack_48);
      }
      else {
        scheme._4_4_ = (uint)*(ushort *)(newurl_local + 0x1e8);
        u._4_4_ = CVar1;
      }
      if (scheme._4_4_ == *(uint *)(newurl_local + 0x13e4)) {
        u._4_4_ = curl_url_get(*(CURLU **)(newurl_local + 0x1198),CURLUPART_SCHEME,(char **)&p,0);
        if (u._4_4_ != CURLUE_OK) {
          (*Curl_cfree)(pcStack_20);
          CVar3 = Curl_uc_to_curlcode(u._4_4_);
          return CVar3;
        }
        pCVar6 = Curl_builtin_scheme((char *)p,0xffffffffffffffff);
        if ((pCVar6 != (Curl_handler *)0x0) &&
           (pCVar6->protocol != *(curl_prot_t *)(newurl_local + 0x1428))) {
          Curl_infof((Curl_easy *)newurl_local,"Clear auth, redirects scheme from %s to %s",
                     *(undefined8 *)(newurl_local + 0x1420),p);
          scheme._3_1_ = 1;
        }
        (*Curl_cfree)(p);
      }
      else {
        Curl_infof((Curl_easy *)newurl_local,"Clear auth, redirects to port from %u to %u",
                   (ulong)*(uint *)(newurl_local + 0x13e4),(ulong)scheme._4_4_);
        scheme._3_1_ = 1;
      }
      CVar1 = u._4_4_;
      if ((scheme._3_1_ & 1) != 0) {
        (*Curl_cfree)(*(void **)(newurl_local + 0x12e0));
        newurl_local[0x12e0] = '\0';
        newurl_local[0x12e1] = '\0';
        newurl_local[0x12e2] = '\0';
        newurl_local[0x12e3] = '\0';
        newurl_local[0x12e4] = '\0';
        newurl_local[0x12e5] = '\0';
        newurl_local[0x12e6] = '\0';
        newurl_local[0x12e7] = '\0';
        (*Curl_cfree)(*(void **)(newurl_local + 0x12e8));
        newurl_local[0x12e8] = '\0';
        newurl_local[0x12e9] = '\0';
        newurl_local[0x12ea] = '\0';
        newurl_local[0x12eb] = '\0';
        newurl_local[0x12ec] = '\0';
        newurl_local[0x12ed] = '\0';
        newurl_local[0x12ee] = '\0';
        newurl_local[0x12ef] = '\0';
        CVar1 = u._4_4_;
      }
    }
  }
  else {
    if (uc != CURLUE_BAD_HANDLE) {
      pcVar5 = curl_url_strerror(u._4_4_);
      Curl_failf((Curl_easy *)pcVar7,"The redirect target URL could not be parsed: %s",pcVar5);
      CVar3 = Curl_uc_to_curlcode(u._4_4_);
      return CVar3;
    }
    pcStack_20 = (*Curl_cstrdup)(pcStack_20);
    CVar1 = u._4_4_;
    if (pcStack_20 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  u._4_4_ = CVar1;
  if (uc == CURLUE_BAD_HANDLE) {
    *(char **)(newurl_local + 0x13a0) = pcStack_20;
    if ((local_26 & 1) == 0) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf((Curl_easy *)newurl_local,"Maximum (%ld) redirects followed",
                 *(undefined8 *)(newurl_local + 0x208));
      data_local._4_4_ = CURLE_TOO_MANY_REDIRECTS;
    }
  }
  else {
    if ((local_25 & 1) != 0) {
      *(uint *)(newurl_local + 0x1300) = *(uint *)(newurl_local + 0x1300) & 0xffffffef;
    }
    if ((*(uint *)(newurl_local + 0x1300) >> 0x11 & 1) != 0) {
      (*Curl_cfree)(*(void **)(newurl_local + 0x11e8));
      newurl_local[0x11e8] = '\0';
      newurl_local[0x11e9] = '\0';
      newurl_local[0x11ea] = '\0';
      newurl_local[0x11eb] = '\0';
      newurl_local[0x11ec] = '\0';
      newurl_local[0x11ed] = '\0';
      newurl_local[0x11ee] = '\0';
      newurl_local[0x11ef] = '\0';
    }
    *(char **)(newurl_local + 0x11e8) = pcStack_20;
    *(uint *)(newurl_local + 0x1300) = *(uint *)(newurl_local + 0x1300) | 0x20000;
    Curl_infof((Curl_easy *)newurl_local,"Issue another request to this URL: \'%s\'",
               *(undefined8 *)(newurl_local + 0x11e8));
    switch(*(undefined4 *)(newurl_local + 0x1358)) {
    case 0x12d:
      if ((((newurl_local[0x11e0] == '\x01') || (newurl_local[0x11e0] == '\x02')) ||
          (newurl_local[0x11e0] == '\x03')) && ((newurl_local[0xa90] & 1U) == 0)) {
        Curl_infof((Curl_easy *)newurl_local,"Switch from POST to GET");
        newurl_local[0x11e0] = '\0';
      }
      break;
    case 0x12e:
      if ((((newurl_local[0x11e0] == '\x01') || (newurl_local[0x11e0] == '\x02')) ||
          (newurl_local[0x11e0] == '\x03')) && ((newurl_local[0xa90] & 2U) == 0)) {
        Curl_infof((Curl_easy *)newurl_local,"Switch from POST to GET");
        newurl_local[0x11e0] = '\0';
      }
      break;
    case 0x12f:
      if ((newurl_local[0x11e0] != '\0') &&
         ((((newurl_local[0x11e0] != '\x01' && (newurl_local[0x11e0] != '\x02')) &&
           (newurl_local[0x11e0] != '\x03')) || ((newurl_local[0xa90] & 4U) == 0)))) {
        newurl_local[0x11e0] = '\0';
        *(ulong *)(newurl_local + 0xa92) = *(ulong *)(newurl_local + 0xa92) & 0xfffffffffbffffff;
        pcVar7 = "GET";
        if ((*(ulong *)(newurl_local + 0xa92) >> 0x19 & 1) != 0) {
          pcVar7 = "HEAD";
        }
        Curl_infof((Curl_easy *)newurl_local,"Switch to %s",pcVar7);
      }
      break;
    case 0x130:
      break;
    case 0x131:
    }
    Curl_pgrsTime((Curl_easy *)newurl_local,TIMER_REDIRECT);
    Curl_pgrsResetTransferSizes((Curl_easy *)newurl_local);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_follow(struct Curl_easy *data,
                     char *newurl,    /* the Location: string */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;
  bool reachedmax = FALSE;
  CURLUcode uc;

  DEBUGASSERT(type != FOLLOW_NONE);

  if(type != FOLLOW_FAKE)
    data->state.requests++; /* count all real follows */
  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
       (data->state.followlocation >= data->set.maxredirs)) {
      reachedmax = TRUE;
      type = FOLLOW_FAKE; /* switch to fake to store the would-be-redirected
                             to URL */
    }
    else {
      /* mark the next request as a followed location: */
      data->state.this_is_a_follow = TRUE;

      data->state.followlocation++; /* count location-followers */

      if(data->set.http_auto_referer) {
        CURLU *u;
        char *referer = NULL;

        /* We are asked to automatically set the previous URL as the referer
           when we get the next URL. We pick the ->url field, which may or may
           not be 100% correct */

        if(data->state.referer_alloc) {
          Curl_safefree(data->state.referer);
          data->state.referer_alloc = FALSE;
        }

        /* Make a copy of the URL without credentials and fragment */
        u = curl_url();
        if(!u)
          return CURLE_OUT_OF_MEMORY;

        uc = curl_url_set(u, CURLUPART_URL, data->state.url, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_FRAGMENT, NULL, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_USER, NULL, 0);
        if(!uc)
          uc = curl_url_set(u, CURLUPART_PASSWORD, NULL, 0);
        if(!uc)
          uc = curl_url_get(u, CURLUPART_URL, &referer, 0);

        curl_url_cleanup(u);

        if(uc || !referer)
          return CURLE_OUT_OF_MEMORY;

        data->state.referer = referer;
        data->state.referer_alloc = TRUE; /* yes, free this later */
      }
    }
  }

  if((type != FOLLOW_RETRY) &&
     (data->req.httpcode != 401) && (data->req.httpcode != 407) &&
     Curl_is_absolute_url(newurl, NULL, 0, FALSE))
    /* If this is not redirect due to a 401 or 407 response and an absolute
       URL: don't allow a custom port number */
    disallowport = TRUE;

  DEBUGASSERT(data->state.uh);
  uc = curl_url_set(data->state.uh, CURLUPART_URL, newurl,
                    (type == FOLLOW_FAKE) ? CURLU_NON_SUPPORT_SCHEME :
                    ((type == FOLLOW_REDIR) ? CURLU_URLENCODE : 0) |
                    CURLU_ALLOW_SPACE |
                    (data->set.path_as_is ? CURLU_PATH_AS_IS : 0));
  if(uc) {
    if(type != FOLLOW_FAKE) {
      failf(data, "The redirect target URL could not be parsed: %s",
            curl_url_strerror(uc));
      return Curl_uc_to_curlcode(uc);
    }

    /* the URL could not be parsed for some reason, but since this is FAKE
       mode, just duplicate the field as-is */
    newurl = strdup(newurl);
    if(!newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else {
    uc = curl_url_get(data->state.uh, CURLUPART_URL, &newurl, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);

    /* Clear auth if this redirects to a different port number or protocol,
       unless permitted */
    if(!data->set.allow_auth_to_other_hosts && (type != FOLLOW_FAKE)) {
      char *portnum;
      int port;
      bool clear = FALSE;

      if(data->set.use_port && data->state.allow_port)
        /* a custom port is used */
        port = (int)data->set.use_port;
      else {
        uc = curl_url_get(data->state.uh, CURLUPART_PORT, &portnum,
                          CURLU_DEFAULT_PORT);
        if(uc) {
          free(newurl);
          return Curl_uc_to_curlcode(uc);
        }
        port = atoi(portnum);
        free(portnum);
      }
      if(port != data->info.conn_remote_port) {
        infof(data, "Clear auth, redirects to port from %u to %u",
              data->info.conn_remote_port, port);
        clear = TRUE;
      }
      else {
        char *scheme;
        const struct Curl_handler *p;
        uc = curl_url_get(data->state.uh, CURLUPART_SCHEME, &scheme, 0);
        if(uc) {
          free(newurl);
          return Curl_uc_to_curlcode(uc);
        }

        p = Curl_builtin_scheme(scheme, CURL_ZERO_TERMINATED);
        if(p && (p->protocol != data->info.conn_protocol)) {
          infof(data, "Clear auth, redirects scheme from %s to %s",
                data->info.conn_scheme, scheme);
          clear = TRUE;
        }
        free(scheme);
      }
      if(clear) {
        Curl_safefree(data->state.aptr.user);
        Curl_safefree(data->state.aptr.passwd);
      }
    }
  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;

    if(reachedmax) {
      failf(data, "Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->state.url_alloc)
    Curl_safefree(data->state.url);

  data->state.url = newurl;
  data->state.url_alloc = TRUE;

  infof(data, "Issue another request to this URL: '%s'", data->state.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behavior is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->state.httpreq == HTTPREQ_POST
        || data->state.httpreq == HTTPREQ_POST_FORM
        || data->state.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET");
      data->state.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behavior is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->state.httpreq == HTTPREQ_POST
        || data->state.httpreq == HTTPREQ_POST_FORM
        || data->state.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET");
      data->state.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* 'See Other' location is not the resource but a substitute for the
     * resource. In this case we switch the method to GET/HEAD, unless the
     * method is POST and the user specified to keep it as POST.
     * https://github.com/curl/curl/issues/5237#issuecomment-614641049
     */
    if(data->state.httpreq != HTTPREQ_GET &&
       ((data->state.httpreq != HTTPREQ_POST &&
         data->state.httpreq != HTTPREQ_POST_FORM &&
         data->state.httpreq != HTTPREQ_POST_MIME) ||
        !(data->set.keep_post & CURL_REDIR_POST_303))) {
      data->state.httpreq = HTTPREQ_GET;
      data->set.upload = false;
      infof(data, "Switch to %s",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}